

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdFreeFundRawTxHandle(void *handle,void *fund_handle)

{
  void *pvVar1;
  long in_RSI;
  string *in_stack_00000018;
  void *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  CfdCapiFundRawTxData *fund_struct;
  int result;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff60;
  allocator *paVar2;
  uint32_t size;
  string *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  allocator local_81;
  string local_80 [32];
  long local_60;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  long local_18;
  
  size = (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 != 0) {
    paVar2 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"FundRawTxData",paVar2);
    size = (uint32_t)((ulong)paVar2 >> 0x20);
    cfd::capi::CheckBuffer(in_stack_00000020,in_stack_00000018);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_60 = local_18;
    if (*(long *)(local_18 + 0x38) != 0) {
      pvVar1 = *(void **)(local_18 + 0x38);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
                  (in_stack_ffffffffffffff20);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_60 + 0x38) = 0;
    }
    if (*(long *)(local_60 + 0x40) != 0) {
      pvVar1 = *(void **)(local_60 + 0x40);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
                  (in_stack_ffffffffffffff20);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_60 + 0x40) = 0;
    }
    if (*(long *)(local_60 + 0x48) != 0) {
      pvVar1 = *(void **)(local_60 + 0x48);
      if (pvVar1 != (void *)0x0) {
        std::
        vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
        ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                 *)in_stack_ffffffffffffff20);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_60 + 0x48) = 0;
    }
    if (*(long *)(local_60 + 0x50) != 0) {
      pvVar1 = *(void **)(local_60 + 0x50);
      if (pvVar1 != (void *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff20);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_60 + 0x50) = 0;
    }
    if (*(long *)(local_60 + 0x58) != 0) {
      pvVar1 = *(void **)(local_60 + 0x58);
      if (pvVar1 != (void *)0x0) {
        std::
        vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
        ::~vector((vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                   *)in_stack_ffffffffffffff20);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_60 + 0x58) = 0;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"FundRawTxData",&local_81);
  cfd::capi::FreeBuffer(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,size);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return 0;
}

Assistant:

int CfdFreeFundRawTxHandle(void* handle, void* fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (fund_handle != nullptr) {
      CheckBuffer(fund_handle, kPrefixFundRawTxData);
      CfdCapiFundRawTxData* fund_struct =
          static_cast<CfdCapiFundRawTxData*>(fund_handle);
      if (fund_struct->utxos != nullptr) {
        delete fund_struct->utxos;
        fund_struct->utxos = nullptr;
      }
      if (fund_struct->input_utxos != nullptr) {
        delete fund_struct->input_utxos;
        fund_struct->input_utxos = nullptr;
      }
#ifndef CFD_DISABLE_ELEMENTS
      if (fund_struct->input_elements_utxos != nullptr) {
        delete fund_struct->input_elements_utxos;
        fund_struct->input_elements_utxos = nullptr;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (fund_struct->append_txout_addresses != nullptr) {
        delete fund_struct->append_txout_addresses;
        fund_struct->append_txout_addresses = nullptr;
      }
      if (fund_struct->targets != nullptr) {
        delete fund_struct->targets;
        fund_struct->targets = nullptr;
      }
    }
    FreeBuffer(
        fund_handle, kPrefixFundRawTxData, sizeof(CfdCapiFundRawTxData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}